

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineReader.cpp
# Opt level: O3

void __thiscall adios2::core::engine::InlineReader::DoClose(InlineReader *this,int transportIndex)

{
  int iVar1;
  ostream *poVar2;
  undefined4 in_register_00000034;
  ScopedTimer __var2233;
  ScopedTimer local_18;
  
  if (DoClose(int)::__var233 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoClose(int)::__var233,
                                CONCAT44(in_register_00000034,transportIndex));
    if (iVar1 != 0) {
      DoClose::__var233 = (void *)ps_timer_create_("InlineReader::DoClose");
      __cxa_guard_release(&DoClose(int)::__var233);
    }
  }
  local_18.m_timer = DoClose::__var233;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  if (this->m_Verbosity == 5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Inline Reader ",0xe);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,this->m_ReaderRank);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," Close(",7);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(this->super_Engine).m_Name._M_dataplus._M_p,
                        (this->super_Engine).m_Name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_18);
  return;
}

Assistant:

void InlineReader::DoClose(const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("InlineReader::DoClose");
    if (m_Verbosity == 5)
    {
        std::cout << "Inline Reader " << m_ReaderRank << " Close(" << m_Name << ")\n";
    }
}